

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O0

void __thiscall
JointActionDiscrete::JointActionDiscrete(JointActionDiscrete *this,JointActionDiscrete *o)

{
  bool bVar1;
  long in_RSI;
  __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
  *in_RDI;
  ActionDiscrete *t;
  const_iterator lastp;
  const_iterator itp;
  vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *this_00;
  __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
  *this_01;
  __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RSI;
  JointAction::JointAction((JointAction *)in_RDI);
  DiscreteEntity::DiscreteEntity((DiscreteEntity *)(in_RDI + 1),(DiscreteEntity *)(local_10 + 8));
  in_RDI->_M_current = (ActionDiscrete **)&PTR__JointActionDiscrete_00d35580;
  in_RDI[1]._M_current = (ActionDiscrete **)&PTR__JointActionDiscrete_00d355c8;
  this_00 = (vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *)(in_RDI + 3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa99553);
  this_01 = in_RDI + 6;
  std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::vector
            ((vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *)0xa99566);
  local_18._M_current =
       (ActionDiscrete **)
       std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::begin(this_00);
  std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
                               *)this_00);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
    ::operator*(&local_18);
    std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::push_back
              ((vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_> *)
               in_stack_ffffffffffffffc0._M_current,(value_type *)this_01);
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<const_ActionDiscrete_*const_*,_std::vector<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>_>
         ::operator++(this_01,(int)((ulong)in_RDI >> 0x20));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)o);
  return;
}

Assistant:

JointActionDiscrete::JointActionDiscrete(const JointActionDiscrete& o) :
    DiscreteEntity(o)
{    
if(DEBUG_JAD)   cout << " cloning joint action ";

    vector<const ActionDiscrete*>::const_iterator itp = o._m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator lastp = o._m_apVector.end();
    while(itp != lastp)
    {
        const ActionDiscrete* t = *itp;
        _m_apVector.push_back(t);
        itp++;
    }
    _m_aIndexVector = o._m_aIndexVector;
}